

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ReusesFeaturesFromSibling_Test::TestBody
          (FeaturesTest_ReusesFeaturesFromSibling_Test *this)

{
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  Nonnull<const_char_*> pcVar3;
  undefined8 extraout_RAX;
  char *pcVar4;
  string_view file_text;
  Metadata MVar5;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30 [2];
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  MVar5 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar5.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    options { features { field_presence: IMPLICIT } }\n    message_type {\n      name: \"Foo\"\n      options { deprecated: true }\n      field {\n        name: \"bar1\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_INT64\n        options {\n          deprecated: true\n          features { field_presence: EXPLICIT }\n        }\n      }\n      field {\n        name: \"baz\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { features { field_presence: EXPLICIT } }\n      }\n    }\n  "
  ;
  file_text._M_len = 599;
  pFVar2 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  if ((long)pFVar2->message_type_count_ < 1) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)pFVar2->message_type_count_,"index < message_type_count()");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    pDVar1 = pFVar2->message_types_;
    local_38.data_ = (AssertHelperData *)pFVar2->merged_features_;
    if ((long)pDVar1->field_count_ < 1) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)pDVar1->field_count_,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_005a8196;
    local_30[0]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pDVar1->fields_->merged_features_;
    testing::internal::
    CmpHelperNE<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet_const*>
              (local_20,"&GetFeatures(file)","&GetFeatures(message->field(0))",
               (FeatureSet **)&local_38,(FeatureSet **)local_30);
    if (local_20[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = (local_18->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22e1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((FeatureSet *)local_30[0]._M_head_impl != (FeatureSet *)0x0) {
        (**(code **)(*(long *)local_30[0]._M_head_impl + 8))();
      }
    }
    if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_18,local_18);
    }
    if ((long)pDVar1->field_count_ < 1) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)pDVar1->field_count_,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      local_38.data_ = (AssertHelperData *)pDVar1->fields_->merged_features_;
      if ((long)pDVar1->field_count_ < 2) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (1,(long)pDVar1->field_count_,"index < field_count()");
      }
      else {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar3 == (Nonnull<const_char_*>)0x0) {
        local_30[0]._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pDVar1->fields_[1].merged_features_;
        testing::internal::
        CmpHelperEQ<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet_const*>
                  (local_20,"&GetFeatures(message->field(0))","&GetFeatures(message->field(1))",
                   (FeatureSet **)&local_38,(FeatureSet **)local_30);
        if (local_20[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_30);
          if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar4 = (local_18->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x22e2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)local_30);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((FeatureSet *)local_30[0]._M_head_impl != (FeatureSet *)0x0) {
            (**(code **)(*(long *)local_30[0]._M_head_impl + 8))();
          }
        }
        if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_18,local_18);
        }
        return;
      }
      goto LAB_005a81b0;
    }
  }
  else {
    TestBody();
LAB_005a8196:
    TestBody();
  }
  TestBody();
LAB_005a81b0:
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((FeatureSet *)local_30[0]._M_head_impl != (FeatureSet *)0x0) {
    (**(code **)(*(long *)local_30[0]._M_head_impl + 8))();
  }
  local_30[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, ReusesFeaturesFromSibling) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    options { features { field_presence: IMPLICIT } }
    message_type {
      name: "Foo"
      options { deprecated: true }
      field {
        name: "bar1"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_INT64
        options {
          deprecated: true
          features { field_presence: EXPLICIT }
        }
      }
      field {
        name: "baz"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { features { field_presence: EXPLICIT } }
      }
    }
  )pb");
  const Descriptor* message = file->message_type(0);
  EXPECT_NE(&GetFeatures(file), &GetFeatures(message->field(0)));
  EXPECT_EQ(&GetFeatures(message->field(0)), &GetFeatures(message->field(1)));
}